

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  __mode_t __mask;
  int iVar2;
  ChStreamOutAscii *pCVar3;
  long *plVar4;
  ostream *poVar5;
  string asciifile;
  string out_dir;
  ChArchiveAsciiDump marchiveout;
  ChStreamOutAsciiFile mfileo;
  long *aplStack_10630 [2];
  long alStack_10620 [2];
  string sStack_10610;
  undefined1 auStack_105f0 [72];
  bool bStack_105a8;
  undefined4 uStack_104ec;
  ChStreamOutAsciiFile *pCStack_104e8;
  undefined1 uStack_104e0;
  ChStreamOutAsciiFile *pCStack_104b8;
  undefined1 auStack_10308 [720];
  ChStreamOutAsciiFile aCStack_10038 [65552];
  
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar3 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar3,"Copyright (c) 2017 projectchrono.org\nChrono version: ");
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,"7.0.0");
  chrono::ChStreamOutAscii::operator<<(pCVar3,"\n\n");
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar3,"CHRONO foundation classes demo: archives (serialization)\n\n");
  plVar4 = (long *)chrono::GetChronoOutputPath_abi_cxx11_();
  sStack_10610._M_dataplus._M_p = (pointer)&sStack_10610.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&sStack_10610,*plVar4,plVar4[1] + *plVar4);
  std::__cxx11::string::append((char *)&sStack_10610);
  filesystem::path::path((path *)auStack_10308,&sStack_10610);
  bVar1 = filesystem::path::is_directory((path *)auStack_10308);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(auStack_10308 + 8));
  }
  else {
    __mask = umask(0);
    filesystem::path::str_abi_cxx11_((string *)auStack_105f0,(path *)auStack_10308,native_path);
    iVar2 = mkdir((char *)auStack_105f0._0_8_,0x1ff);
    if ((undefined1 *)auStack_105f0._0_8_ != auStack_105f0 + 0x10) {
      operator_delete((void *)auStack_105f0._0_8_,auStack_105f0._16_8_ + 1);
    }
    umask(__mask);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(auStack_10308 + 8));
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error creating directory ",0x19);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,sStack_10610._M_dataplus._M_p,
                          sStack_10610._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      iVar2 = 1;
      std::ostream::flush();
      goto LAB_0011cfeb;
    }
  }
  aplStack_10630[0] = alStack_10620;
  std::__cxx11::string::_M_construct<char*>
            ((string *)aplStack_10630,sStack_10610._M_dataplus._M_p,
             sStack_10610._M_dataplus._M_p + sStack_10610._M_string_length);
  std::__cxx11::string::append((char *)aplStack_10630);
  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
            ((ChStreamOutAsciiFile *)auStack_10308,(char *)aplStack_10630[0],_S_trunc);
  chrono::ChArchiveOut::ChArchiveOut((ChArchiveOut *)auStack_105f0);
  auStack_105f0._0_8_ = &PTR__ChArchiveOut_00159078;
  uStack_104ec = 0;
  bStack_105a8 = false;
  uStack_104e0 = 0;
  pCStack_104e8 = aCStack_10038;
  my_serialization_example((ChArchiveOut *)auStack_105f0);
  chrono::ChArchiveOut::~ChArchiveOut((ChArchiveOut *)auStack_105f0);
  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)auStack_10308);
  if (aplStack_10630[0] != alStack_10620) {
    operator_delete(aplStack_10630[0],alStack_10620[0] + 1);
  }
  aplStack_10630[0] = alStack_10620;
  std::__cxx11::string::_M_construct<char*>
            ((string *)aplStack_10630,sStack_10610._M_dataplus._M_p,
             sStack_10610._M_dataplus._M_p + sStack_10610._M_string_length);
  std::__cxx11::string::append((char *)aplStack_10630);
  chrono::ChStreamOutBinaryFile::ChStreamOutBinaryFile
            ((ChStreamOutBinaryFile *)auStack_10308,(char *)aplStack_10630[0],_S_trunc);
  chrono::ChArchiveOut::ChArchiveOut((ChArchiveOut *)auStack_105f0);
  auStack_105f0._0_8_ = &PTR__ChArchiveOut_00159130;
  pCStack_104e8 = aCStack_10038;
  my_serialization_example((ChArchiveOut *)auStack_105f0);
  chrono::ChArchiveOut::~ChArchiveOut((ChArchiveOut *)auStack_105f0);
  chrono::ChStreamOutBinaryFile::~ChStreamOutBinaryFile((ChStreamOutBinaryFile *)auStack_10308);
  if (aplStack_10630[0] != alStack_10620) {
    operator_delete(aplStack_10630[0],alStack_10620[0] + 1);
  }
  aplStack_10630[0] = alStack_10620;
  std::__cxx11::string::_M_construct<char*>
            ((string *)aplStack_10630,sStack_10610._M_dataplus._M_p,
             sStack_10610._M_dataplus._M_p + sStack_10610._M_string_length);
  std::__cxx11::string::append((char *)aplStack_10630);
  chrono::ChStreamInBinaryFile::ChStreamInBinaryFile
            ((ChStreamInBinaryFile *)auStack_10308,(char *)aplStack_10630[0]);
  chrono::ChArchiveIn::ChArchiveIn((ChArchiveIn *)auStack_105f0);
  auStack_105f0._0_8_ = &PTR__ChArchiveIn_001591f0;
  pCStack_104b8 = aCStack_10038;
  my_deserialization_example((ChArchiveIn *)auStack_105f0);
  chrono::ChArchiveIn::~ChArchiveIn((ChArchiveIn *)auStack_105f0);
  chrono::ChStreamInBinaryFile::~ChStreamInBinaryFile((ChStreamInBinaryFile *)auStack_10308);
  if (aplStack_10630[0] != alStack_10620) {
    operator_delete(aplStack_10630[0],alStack_10620[0] + 1);
  }
  aplStack_10630[0] = alStack_10620;
  std::__cxx11::string::_M_construct<char*>
            ((string *)aplStack_10630,sStack_10610._M_dataplus._M_p,
             sStack_10610._M_dataplus._M_p + sStack_10610._M_string_length);
  std::__cxx11::string::append((char *)aplStack_10630);
  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
            ((ChStreamOutAsciiFile *)auStack_10308,(char *)aplStack_10630[0],_S_trunc);
  chrono::ChArchiveOutJSON::ChArchiveOutJSON
            ((ChArchiveOutJSON *)auStack_105f0,(ChStreamOutAsciiFile *)auStack_10308);
  my_serialization_example((ChArchiveOut *)auStack_105f0);
  chrono::ChArchiveOutJSON::~ChArchiveOutJSON((ChArchiveOutJSON *)auStack_105f0);
  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)auStack_10308);
  if (aplStack_10630[0] != alStack_10620) {
    operator_delete(aplStack_10630[0],alStack_10620[0] + 1);
  }
  aplStack_10630[0] = alStack_10620;
  std::__cxx11::string::_M_construct<char*>
            ((string *)aplStack_10630,sStack_10610._M_dataplus._M_p,
             sStack_10610._M_dataplus._M_p + sStack_10610._M_string_length);
  std::__cxx11::string::append((char *)aplStack_10630);
  chrono::ChStreamInAsciiFile::ChStreamInAsciiFile
            ((ChStreamInAsciiFile *)auStack_10308,(char *)aplStack_10630[0]);
  chrono::ChArchiveInJSON::ChArchiveInJSON
            ((ChArchiveInJSON *)auStack_105f0,(ChStreamInAsciiFile *)auStack_10308);
  my_deserialization_example((ChArchiveIn *)auStack_105f0);
  chrono::ChArchiveInJSON::~ChArchiveInJSON((ChArchiveInJSON *)auStack_105f0);
  chrono::ChStreamInAsciiFile::~ChStreamInAsciiFile((ChStreamInAsciiFile *)auStack_10308);
  if (aplStack_10630[0] != alStack_10620) {
    operator_delete(aplStack_10630[0],alStack_10620[0] + 1);
  }
  aplStack_10630[0] = alStack_10620;
  std::__cxx11::string::_M_construct<char*>
            ((string *)aplStack_10630,sStack_10610._M_dataplus._M_p,
             sStack_10610._M_dataplus._M_p + sStack_10610._M_string_length);
  std::__cxx11::string::append((char *)aplStack_10630);
  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
            ((ChStreamOutAsciiFile *)auStack_10308,(char *)aplStack_10630[0],_S_trunc);
  chrono::ChArchiveOutXML::ChArchiveOutXML
            ((ChArchiveOutXML *)auStack_105f0,(ChStreamOutAsciiFile *)auStack_10308);
  my_serialization_example((ChArchiveOut *)auStack_105f0);
  chrono::ChArchiveOutXML::~ChArchiveOutXML((ChArchiveOutXML *)auStack_105f0);
  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)auStack_10308);
  if (aplStack_10630[0] != alStack_10620) {
    operator_delete(aplStack_10630[0],alStack_10620[0] + 1);
  }
  aplStack_10630[0] = alStack_10620;
  std::__cxx11::string::_M_construct<char*>
            ((string *)aplStack_10630,sStack_10610._M_dataplus._M_p,
             sStack_10610._M_dataplus._M_p + sStack_10610._M_string_length);
  std::__cxx11::string::append((char *)aplStack_10630);
  chrono::ChStreamInAsciiFile::ChStreamInAsciiFile
            ((ChStreamInAsciiFile *)auStack_105f0,(char *)aplStack_10630[0]);
  chrono::ChArchiveInXML::ChArchiveInXML
            ((ChArchiveInXML *)auStack_10308,(ChStreamInAsciiFile *)auStack_105f0);
  my_deserialization_example((ChArchiveIn *)auStack_10308);
  chrono::ChArchiveInXML::~ChArchiveInXML((ChArchiveInXML *)auStack_10308);
  chrono::ChStreamInAsciiFile::~ChStreamInAsciiFile((ChStreamInAsciiFile *)auStack_105f0);
  if (aplStack_10630[0] != alStack_10620) {
    operator_delete(aplStack_10630[0],alStack_10620[0] + 1);
  }
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar3,"Serialization test ended with success.\n\n");
  my_reflection_example();
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar3,"Reflection test ended with success.\n");
  iVar2 = 0;
LAB_0011cfeb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_10610._M_dataplus._M_p != &sStack_10610.field_2) {
    operator_delete(sStack_10610._M_dataplus._M_p,sStack_10610.field_2._M_allocated_capacity + 1);
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[]) {
    GetLog() << "Copyright (c) 2017 projectchrono.org\nChrono version: " << CHRONO_VERSION << "\n\n";

    GetLog() << "CHRONO foundation classes demo: archives (serialization)\n\n";

    // Create (if needed) output directory
    const std::string out_dir = GetChronoOutputPath() + "DEMO_ARCHIVE";
    if (!filesystem::create_directory(filesystem::path(out_dir))) {
        std::cout << "Error creating directory " << out_dir << std::endl;
        return 1;
    }

    //  Archives inherited from the base class ChArchiveOut can be
    // used to serialize objects, and streams inherited from ChArchiveIn
    // can be used to get them back. For example, file streams like
    // ChArchiveOutBinary and ChArchiveInBinary can be used for this
    // purpose.
    
    try {       
        
		
        {
            //
            // Example: SERIALIZE TO ASCII DUMP (useful for debugging etc.):
            //

            std::string asciifile = out_dir + "/foo_archive.txt";
            ChStreamOutAsciiFile mfileo(asciifile.c_str());

            // Create an ASCII archive object, for dumping C++ objects into a readable file
            ChArchiveAsciiDump marchiveout(mfileo);
        
            my_serialization_example(marchiveout);
        }


        {
            //
            // Example: SERIALIZE TO/FROM BINARY:
            //

            {
                std::string binfile = out_dir + "/foo_archive.dat";
                ChStreamOutBinaryFile mfileo(binfile.c_str());
                
				// Use a binary archive object to serialize C++ objects into the binary file
                ChArchiveOutBinary marchiveout(mfileo);

                my_serialization_example(marchiveout);
            }

            {
                std::string binfile = out_dir + "/foo_archive.dat";
                ChStreamInBinaryFile mfilei(binfile.c_str());
                
				// Use a binary archive object to deserialize C++ objects from the binary file
                ChArchiveInBinary marchivein(mfilei);

                my_deserialization_example(marchivein);
            }
        }


        {
            //
            // Example: SERIALIZE TO/FROM JSON:
            //

            {
                std::string jsonfile = out_dir + "/foo_archive.json";
                ChStreamOutAsciiFile mfileo(jsonfile.c_str());

                // Use a JSON archive object to serialize C++ objects into the file
                ChArchiveOutJSON marchiveout(mfileo);
        
                my_serialization_example(marchiveout);
            }

            
            {
                std::string jsonfile = out_dir + "/foo_archive.json";
                ChStreamInAsciiFile mfilei(jsonfile.c_str());

				// Use a JSON archive object to deserialize C++ objects from the file
                ChArchiveInJSON marchivein(mfilei);

                my_deserialization_example(marchivein);
            }
            
        }


		{
			//
			// Example: SERIALIZE TO/FROM XML
			//
			{
				std::string xmlfile = out_dir + "/foo_archive.xml";
				ChStreamOutAsciiFile mfileo(xmlfile.c_str());

				// Use a XML archive object to serialize C++ objects into the file
				ChArchiveOutXML marchiveout(mfileo);

				my_serialization_example(marchiveout);
			}

			{
				std::string xmlfile = out_dir + "/foo_archive.xml";
				ChStreamInAsciiFile mfilei(xmlfile.c_str());

				// Use a XML archive object to deserialize C++ objects from the file
				ChArchiveInXML marchivein(mfilei);

				my_deserialization_example(marchivein);
			}

		}


        GetLog() << "Serialization test ended with success.\n\n";


        my_reflection_example();

        GetLog() << "Reflection test ended with success.\n";


		

    } catch (const ChException &myex) {
        GetLog() << "ERROR: " << myex.what() << "\n\n";
    }


    return 0;
}